

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

void __thiscall
FastVector<LargeBlock<32,_2048>_*,_false,_false>::grow_and_add
          (FastVector<LargeBlock<32,_2048>_*,_false,_false> *this,uint newSize,
          LargeBlock<32,_2048> **val)

{
  uint uVar1;
  uint uVar2;
  LargeBlock<32,_2048> **ptr;
  LargeBlock<32,_2048> *pLVar3;
  uint oldMax;
  LargeBlock<32,_2048> **oldData;
  LargeBlock<32,_2048> **val_local;
  uint newSize_local;
  FastVector<LargeBlock<32,_2048>_*,_false,_false> *this_local;
  
  ptr = this->data;
  uVar1 = this->max;
  grow_no_destroy(this,newSize);
  pLVar3 = *val;
  uVar2 = this->count;
  this->count = uVar2 + 1;
  this->data[uVar2] = pLVar3;
  if (ptr != (LargeBlock<32,_2048> **)0x0) {
    NULLC::destruct<LargeBlock<32,2048>*>(ptr,(ulong)uVar1);
  }
  return;
}

Assistant:

void grow_and_add(unsigned newSize, const T& val)
	{
		T* oldData = data;
		unsigned oldMax = max;

		grow_no_destroy(newSize);

		data[count++] = val;

		if(oldData)
		{
			if(!skipConstructor)
				NULLC::destruct(oldData, oldMax);
			else
				NULLC::alignedDealloc(oldData);
		}
	}